

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

int pbrt::ParameterTypeTraits<(pbrt::ParameterType)2>::Convert(double *v,FileLoc *loc)

{
  int iVar1;
  int high;
  FileLoc *in_RSI;
  double *in_RDI;
  double dVar2;
  FileLoc *unaff_retaddr;
  double *args;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  args = (double *)*in_RDI;
  iVar1 = std::numeric_limits<int>::max();
  if ((double)args <= (double)iVar1) {
    dVar2 = *in_RDI;
    iVar1 = std::numeric_limits<int>::lowest();
    if ((double)iVar1 <= dVar2) {
      if (((double)(int)*in_RDI != *in_RDI) || (NAN((double)(int)*in_RDI) || NAN(*in_RDI))) {
        Warning<double_const&>
                  (in_RSI,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),args
                  );
      }
    }
    else {
      iVar1 = std::numeric_limits<int>::lowest();
      Warning<double_const&,int>
                (unaff_retaddr,(char *)in_RDI,(double *)in_RSI,
                 (int *)CONCAT44(in_stack_ffffffffffffffec,iVar1));
    }
  }
  else {
    iVar1 = std::numeric_limits<int>::max();
    Warning<double_const&,int>
              (unaff_retaddr,(char *)in_RDI,(double *)in_RSI,
               (int *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  }
  dVar2 = *in_RDI;
  iVar1 = std::numeric_limits<int>::lowest();
  high = std::numeric_limits<int>::max();
  dVar2 = Clamp<double,int,int>(dVar2,iVar1,high);
  return (int)dVar2;
}

Assistant:

static int Convert(const double *v, const FileLoc *loc) {
        if (*v > std::numeric_limits<int>::max())
            Warning(loc,
                    "Numeric value %f too large to represent as an integer. "
                    "Clamping to %d",
                    *v, std::numeric_limits<int>::max());
        else if (*v < std::numeric_limits<int>::lowest())
            Warning(loc,
                    "Numeric value %f too low to represent as an integer. "
                    "Clamping to %d",
                    *v, std::numeric_limits<int>::lowest());
        else if (double(int(*v)) != *v)
            Warning(loc, "Floating-point value %f will be rounded to an integer", *v);

        return int(Clamp(*v, std::numeric_limits<int>::lowest(),
                         std::numeric_limits<int>::max()));
    }